

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<kj::String>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::String>::apply
          (Maybe<kj::Array<kj::String>_> *__return_storage_ptr__,
          Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>
          *subParser,ParserInput *input)

{
  char *pcVar1;
  String *pSVar2;
  String *pSVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  Maybe<kj::Array<kj::String>_> *pMVar7;
  size_t newSize;
  ParserInput subInput;
  Vector<kj::String> local_c8;
  Maybe<kj::Array<kj::String>_> *local_a0;
  ParserInput local_98;
  char local_70;
  char *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  Maybe<kj::String> local_50;
  
  local_c8.builder.ptr = (String *)0x0;
  local_c8.builder.pos = (String *)0x0;
  local_c8.builder.endPtr = (String *)0x0;
  local_c8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_a0 = __return_storage_ptr__;
  do {
    pcVar6 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar6 == pcVar1) break;
    local_98.begin = input->begin;
    local_98.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_98.super_IteratorInput<char,_const_char_*>.pos = pcVar6;
    local_98.super_IteratorInput<char,_const_char_*>.end = pcVar1;
    local_98.super_IteratorInput<char,_const_char_*>.best = pcVar6;
    Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>(&local_50,subParser,&local_98);
    bVar4 = local_50.ptr.isSet;
    local_70 = local_50.ptr.isSet;
    if (local_50.ptr.isSet == true) {
      local_68 = local_50.ptr.field_1.value.content.ptr;
      local_60 = local_50.ptr.field_1.value.content.size_;
      pAStack_58 = local_50.ptr.field_1.value.content.disposer;
      ((IteratorInput<char,_const_char_*> *)
      &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
           local_98.super_IteratorInput<char,_const_char_*>.pos;
      if (local_c8.builder.pos == local_c8.builder.endPtr) {
        newSize = ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_c8.builder.pos == local_c8.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::String>::setCapacity(&local_c8,newSize);
      }
      ((local_c8.builder.pos)->content).ptr = local_68;
      ((local_c8.builder.pos)->content).size_ = local_60;
      ((local_c8.builder.pos)->content).disposer = pAStack_58;
      local_c8.builder.pos = local_c8.builder.pos + 1;
    }
    if ((ParserInput *)local_98.super_IteratorInput<char,_const_char_*>.parent != (ParserInput *)0x0
       ) {
      pcVar6 = local_98.super_IteratorInput<char,_const_char_*>.best;
      if (local_98.super_IteratorInput<char,_const_char_*>.best <
          local_98.super_IteratorInput<char,_const_char_*>.pos) {
        pcVar6 = local_98.super_IteratorInput<char,_const_char_*>.pos;
      }
      pcVar1 = ((IteratorInput<char,_const_char_*> *)
               &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->best;
      if (pcVar6 <= pcVar1) {
        pcVar6 = pcVar1;
      }
      ((IteratorInput<char,_const_char_*> *)
      &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->best = pcVar6;
    }
  } while (bVar4 != false);
  pMVar7 = local_a0;
  pSVar3 = local_c8.builder.endPtr;
  pSVar2 = local_c8.builder.ptr;
  lVar5 = (long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3;
  if ((long)local_c8.builder.pos - (long)local_c8.builder.ptr == 0) {
    (local_a0->ptr).isSet = false;
    if (local_c8.builder.ptr != (String *)0x0) {
      local_c8.builder.ptr = (String *)0x0;
      local_c8.builder.pos = (RemoveConst<kj::String> *)0x0;
      local_c8.builder.endPtr = (String *)0x0;
      (**(local_c8.builder.disposer)->_vptr_ArrayDisposer)
                (local_c8.builder.disposer,pSVar2,0x18,lVar5 * -0x5555555555555555,
                 ((long)pSVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  else {
    if (local_c8.builder.pos != local_c8.builder.endPtr) {
      Vector<kj::String>::setCapacity(&local_c8,lVar5 * -0x5555555555555555);
    }
    (local_a0->ptr).isSet = true;
    (local_a0->ptr).field_1.value.ptr = local_c8.builder.ptr;
    (local_a0->ptr).field_1.value.size_ =
         ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) * -0x5555555555555555;
    (local_a0->ptr).field_1.value.disposer = local_c8.builder.disposer;
    pMVar7 = local_a0;
  }
  return pMVar7;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }